

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::
SmallVectorBase<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_>
::emplace_back<slang::ast::LValue::ArrayLookup>
          (SmallVectorBase<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_>
           *this,ArrayLookup *args)

{
  size_type sVar1;
  pointer pvVar2;
  
  if (this->len == this->cap) {
    pvVar2 = emplaceRealloc<slang::ast::LValue::ArrayLookup>(this,this->data_ + this->len,args);
    return pvVar2;
  }
  std::
  variant<slang::ast::LValue::BitSlice,slang::ast::LValue::ElementIndex,slang::ast::LValue::ArraySlice,slang::ast::LValue::ArrayLookup>
  ::variant<slang::ast::LValue::ArrayLookup,void,void,slang::ast::LValue::ArrayLookup,void>
            ((variant<slang::ast::LValue::BitSlice,slang::ast::LValue::ElementIndex,slang::ast::LValue::ArraySlice,slang::ast::LValue::ArrayLookup>
              *)(this->data_ + this->len),args);
  sVar1 = this->len;
  this->len = sVar1 + 1;
  return this->data_ + sVar1;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }